

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_mat_t
ncnn_mat_create_external_4d_elem
          (int w,int h,int d,int c,void *data,size_t elemsize,int elempack,
          ncnn_allocator_t allocator)

{
  ncnn_mat_t p_Var1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 local_a8;
  
  p_Var1 = (ncnn_mat_t)operator_new(0x48);
  if (in_stack_00000010 == (undefined8 *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = *in_stack_00000010;
  }
  *(undefined8 *)p_Var1 = in_R8;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = in_R9;
  *(undefined4 *)(p_Var1 + 0x18) = in_stack_00000008;
  *(undefined8 *)(p_Var1 + 0x20) = local_a8;
  *(undefined4 *)(p_Var1 + 0x28) = 4;
  *(undefined4 *)(p_Var1 + 0x2c) = in_EDI;
  *(undefined4 *)(p_Var1 + 0x30) = in_ESI;
  *(undefined4 *)(p_Var1 + 0x34) = in_EDX;
  *(undefined4 *)(p_Var1 + 0x38) = in_ECX;
  *(ulong *)(p_Var1 + 0x40) =
       ((long)*(int *)(p_Var1 + 0x2c) * (long)*(int *)(p_Var1 + 0x30) *
        (long)*(int *)(p_Var1 + 0x34) * *(long *)(p_Var1 + 0x10) + 0xfU & 0xfffffffffffffff0) /
       *(ulong *)(p_Var1 + 0x10);
  return p_Var1;
}

Assistant:

ncnn_mat_t ncnn_mat_create_external_4d_elem(int w, int h, int d, int c, void* data, size_t elemsize, int elempack, ncnn_allocator_t allocator)
{
    return (ncnn_mat_t)(new Mat(w, h, d, c, data, elemsize, elempack, allocator ? (Allocator*)allocator->pthis : NULL));
}